

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O1

PipelineFor<DynamicCapability> *
capnp::DynamicValue::Pipeline::AsImpl<capnp::DynamicCapability,_(capnp::Kind)7>::apply
          (PipelineFor<DynamicCapability> *__return_storage_ptr__,Pipeline *pipeline)

{
  if (pipeline->type == CAPABILITY) {
    (__return_storage_ptr__->super_Client).hook.disposer =
         (Disposer *)(pipeline->field_1).structValue.schema.super_Schema.raw;
    (__return_storage_ptr__->super_Client).hook.ptr =
         (ClientHook *)(pipeline->field_1).structValue.typeless.hook.disposer;
    (pipeline->field_1).structValue.typeless.hook.disposer = (Disposer *)0x0;
    (__return_storage_ptr__->schema).super_Schema.raw =
         (RawBrandedSchema *)(pipeline->field_1).structValue.typeless.hook.ptr;
  }
  else {
    AsImpl<capnp::DynamicCapability,(capnp::Kind)7>::apply(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

PipelineFor<DynamicCapability> DynamicValue::Pipeline::AsImpl<DynamicCapability>::apply(
    Pipeline& pipeline) {
  KJ_REQUIRE(pipeline.type == CAPABILITY, "Pipeline type mismatch.") {
    return DynamicCapability::Client();
  }
  return kj::mv(pipeline.capabilityValue);
}